

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rk_list.cpp
# Opt level: O0

RK_S32 __thiscall rk_list::del_at_head(rk_list *this,void *data,RK_S32 size)

{
  RK_S32 local_20;
  RK_S32 ret;
  RK_S32 size_local;
  void *data_local;
  rk_list *this_local;
  
  local_20 = -0x16;
  pthread_mutex_lock((pthread_mutex_t *)this);
  if ((this->head != (rk_list_node *)0x0) && (this->count != 0)) {
    _list_del_node_no_lock(this->head->next,data,size);
    this->count = this->count + -1;
    local_20 = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return local_20;
}

Assistant:

RK_S32 rk_list::del_at_head(void *data, RK_S32 size)
{
    RK_S32 ret = -EINVAL;
    pthread_mutex_lock(&mutex);
    if (head && count) {
        _list_del_node_no_lock(head->next, data, size);
        count--;
        ret = 0;
    }
    pthread_mutex_unlock(&mutex);
    return ret;
}